

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  FuncDeclaration *pFVar1;
  vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_> *pvVar2;
  vector<wabt::Expr_*,_std::allocator<wabt::Expr_*>_> *this_00;
  ModuleFieldType MVar3;
  int iVar4;
  pointer pRVar5;
  ResolveFuncs *__first;
  ResolveFuncs *__last;
  pointer pRVar6;
  Errors *errors;
  pointer pTVar7;
  pointer pTVar8;
  bool bVar9;
  bool bVar10;
  TokenType TVar11;
  TokenType TVar12;
  Result RVar13;
  _Hash_node_base *p_Var14;
  _func_int **pp_Var15;
  ModuleField *field;
  ModuleField *pMVar16;
  TokenTypePair pair;
  pointer pRVar17;
  pointer pRVar18;
  FuncDeclaration *decl;
  Func *func;
  pointer pRVar19;
  ResolveTypes it;
  ResolveFuncTypesExprVisitorDelegate delegate;
  ExprVisitor local_b0;
  Delegate local_48;
  Module *local_40;
  Errors *local_38;
  
  pRVar18 = (this->resolve_types_).
            super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar5 = (this->resolve_types_).
           super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar17 = pRVar18;
  if (pRVar5 != pRVar18) {
    do {
      std::vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
      ~vector(&pRVar17->vars);
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 != pRVar5);
    (this->resolve_types_).
    super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar18;
  }
  __first = (this->resolve_funcs_).
            super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __last = (this->resolve_funcs_).
           super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    std::_Destroy_aux<false>::__destroy<wabt::WastParser::ResolveFuncs*>(__first,__last);
    (this->resolve_funcs_).
    super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first;
  }
LAB_0013998d:
  do {
    TVar11 = Peek(this,0);
    TVar12 = Peek(this,1);
    pair._M_elems[1] = TVar12;
    pair._M_elems[0] = TVar11;
    bVar9 = anon_unknown_1::IsModuleField(pair);
    if ((!bVar9) && (bVar9 = PeekIsCustom(this), !bVar9)) {
      pRVar18 = (this->resolve_types_).
                super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar5 = (this->resolve_types_).
               super__Vector_base<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar18 == pRVar5) {
        bVar9 = false;
      }
      else {
        pvVar2 = &local_b0.state_stack_;
        bVar9 = false;
        do {
          local_b0.delegate_ = (Delegate *)pRVar18->target_types;
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                  *)pvVar2,&pRVar18->vars);
          RVar13 = ResolveRefTypes(module,(TypeVector *)local_b0.delegate_,(ReferenceVars *)pvVar2,
                                   this->errors_);
          bVar9 = (bool)(bVar9 | RVar13.enum_ == Error);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          ~vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                   *)pvVar2);
          pRVar18 = pRVar18 + 1;
        } while (pRVar18 != pRVar5);
      }
      pRVar19 = (this->resolve_funcs_).
                super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar6 = (this->resolve_funcs_).
               super__Vector_base<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar19 != pRVar6) {
        pvVar2 = &local_b0.state_stack_;
        this_00 = &local_b0.expr_stack_;
        do {
          local_b0.delegate_ = (Delegate *)pRVar19->target_func;
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)pvVar2,&pRVar19->types);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                  *)this_00,&pRVar19->vars);
          RVar13 = ResolveRefTypes(module,(TypeVector *)pvVar2,(ReferenceVars *)this_00,
                                   this->errors_);
          LocalTypes::Set((LocalTypes *)((long)local_b0.delegate_ + 0xa0),(TypeVector *)pvVar2);
          std::
          vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>::
          ~vector((vector<wabt::WastParser::ReferenceVar,_std::allocator<wabt::WastParser::ReferenceVar>_>
                   *)this_00);
          if (local_b0.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b0.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.state_stack_.
                                  super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar9 = (bool)(bVar9 | RVar13.enum_ == Error);
          pRVar19 = pRVar19 + 1;
        } while (pRVar19 != pRVar6);
      }
      if (bVar9) {
        return (Result)Error;
      }
      pMVar16 = (module->fields).first_;
      if (pMVar16 == (ModuleField *)0x0) goto LAB_00139d04;
      errors = this->errors_;
      bVar9 = false;
      do {
        MVar3 = pMVar16->type_;
        if (MVar3 == Tag) {
          decl = (FuncDeclaration *)&pMVar16[1].loc.filename._M_str;
          bVar10 = true;
LAB_00139b8d:
          func = (Func *)0x0;
        }
        else {
          if (MVar3 == Import) {
            pp_Var15 = pMVar16[1]._vptr_ModuleField;
            iVar4 = *(int *)(pp_Var15 + 9);
            bVar10 = pp_Var15 != (_func_int **)0x0;
            pFVar1 = (FuncDeclaration *)(pp_Var15 + 0xe);
            if (iVar4 != 4) {
              pp_Var15 = (_func_int **)0x0;
            }
            decl = (FuncDeclaration *)(pp_Var15 + 0xe);
            if (pp_Var15 == (_func_int **)0x0) {
              decl = (FuncDeclaration *)0x0;
            }
            if (bVar10 && iVar4 == 0) {
              decl = pFVar1;
            }
            bVar10 = pp_Var15 != (_func_int **)0x0 || bVar10 && iVar4 == 0;
            goto LAB_00139b8d;
          }
          if (MVar3 == Func) {
            func = (Func *)(pMVar16 + 1);
            decl = (FuncDeclaration *)&pMVar16[1].loc.filename._M_str;
            bVar10 = true;
          }
          else {
            decl = (FuncDeclaration *)0x0;
            func = (Func *)0x0;
            bVar10 = false;
          }
        }
        if (bVar10) {
          if (decl == (FuncDeclaration *)0x0) {
            bVar10 = false;
          }
          else {
            bVar10 = anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
            anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar16->loc,module,decl);
            RVar13 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit
                               (&pMVar16->loc,module,decl,errors);
            bVar9 = RVar13.enum_ == Error || bVar9;
          }
          if (func != (Func *)0x0) {
            if ((bVar10 != false) &&
               (p_Var14 = (func->bindings).
                          super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                          ._M_h._M_before_begin._M_nxt, p_Var14 != (_Hash_node_base *)0x0)) {
              pTVar7 = (func->decl).sig.param_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pTVar8 = (func->decl).sig.param_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                *(int *)&p_Var14[9]._M_nxt =
                     *(int *)&p_Var14[9]._M_nxt + (int)((ulong)((long)pTVar7 - (long)pTVar8) >> 3);
                p_Var14 = p_Var14->_M_nxt;
              } while (p_Var14 != (_Hash_node_base *)0x0);
            }
            local_48._vptr_Delegate = (_func_int **)&PTR__Delegate_001a3ad8;
            local_40 = module;
            local_38 = errors;
            ExprVisitor::ExprVisitor(&local_b0,&local_48);
            RVar13 = ExprVisitor::VisitFunc(&local_b0,func);
            if (local_b0.catch_index_stack_.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.catch_index_stack_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.catch_index_stack_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.catch_index_stack_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.expr_iter_stack_.
                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.expr_iter_stack_.
                                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.expr_iter_stack_.
                                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.expr_stack_.
                                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.expr_stack_.
                                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_b0.state_stack_.
                                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_b0.state_stack_.
                                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar9 = bVar9 || RVar13.enum_ == Error;
          }
        }
        pMVar16 = (pMVar16->super_intrusive_list_base<wabt::ModuleField>).next_;
        if (pMVar16 == (ModuleField *)0x0) {
          if (bVar9) {
            return (Result)Error;
          }
LAB_00139d04:
          RVar13 = ResolveNamesModule(module,this->errors_);
          return (Result)(uint)(RVar13.enum_ == Error);
        }
      } while( true );
    }
    bVar9 = PeekIsCustom(this);
    if (bVar9) {
      RVar13 = ParseCustomSectionAnnotation(this,module);
    }
    else {
      RVar13 = ParseModuleField(this,module);
      if (RVar13.enum_ != Error) goto LAB_0013998d;
      RVar13 = Synchronize(this,anon_unknown_1::IsModuleField);
    }
    if (RVar13.enum_ == Error) {
      return (Result)Error;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);

  // Reset module-specific state.
  resolve_types_.clear();
  resolve_funcs_.clear();

  while (IsModuleField(PeekPair()) || PeekIsCustom()) {
    if (PeekIsCustom()) {
      CHECK_RESULT(ParseCustomSectionAnnotation(module));
      continue;
    }
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }

  // Module parsing is completed, type names can be resolved now.
  Result result = Result::Ok;

  for (auto it : resolve_types_) {
    result |= ResolveRefTypes(*module, it.target_types, &it.vars, errors_);
  }

  for (auto it : resolve_funcs_) {
    result |= ResolveRefTypes(*module, &it.types, &it.vars, errors_);
    it.target_func->local_types.Set(it.types);
  }

  CHECK_RESULT(result);
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}